

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O3

void __thiscall
r_exec::IPGMContext::copy_structure<r_exec::View>
          (IPGMContext *this,View *destination,uint16_t write_index,uint16_t *extent_index,
          bool dereference_cptr,int64_t pgm_index)

{
  Atom *pAVar1;
  int iVar2;
  undefined4 uVar3;
  char cVar4;
  bool bVar5;
  ushort uVar6;
  ushort uVar7;
  short sVar8;
  uint uVar9;
  Operator *pOVar10;
  undefined6 in_register_00000012;
  undefined7 in_register_00000081;
  ulong uVar11;
  uint16_t index;
  ulong uVar12;
  Atom a;
  Atom local_88 [4];
  undefined4 local_84;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  uint16_t *local_68;
  IPGMContext local_60;
  
  local_84 = (undefined4)CONCAT71(in_register_00000081,dereference_cptr);
  uVar11 = CONCAT62(in_register_00000012,write_index) & 0xffffffff;
  cVar4 = r_code::Atom::getDescriptor();
  if (cVar4 == -0x3b) {
    uVar6 = r_code::Atom::asOpcode();
    pOVar10 = r_code::vector<r_exec::Operator>::operator[]
                        ((vector<r_exec::Operator> *)Operator::Operators,(ulong)uVar6);
    if (pOVar10->_operator == syn) {
      getChild(&local_60,this,1);
      copy_member<r_exec::View>
                (&local_60,destination,(uint16_t)uVar11,extent_index,local_84._0_1_,pgm_index);
      return;
    }
  }
  local_80 = pgm_index;
  r_code::Atom::operator=
            ((Atom *)((long)(destination->super_View).references + (ulong)write_index * 4 + 0x18),
             (this->super__Context).code + (ulong)(this->super__Context).index * 4);
  uVar9 = (*(this->super__Context)._vptr__Context[6])(this);
  uVar6 = (ushort)uVar9;
  *extent_index = uVar6 + write_index + 1;
  cVar4 = r_code::Atom::getDescriptor();
  iVar2 = (int)CONCAT62(in_register_00000012,write_index);
  if (cVar4 != -0x40) {
    if (cVar4 == -0x39) {
      if (uVar6 == 0) {
        return;
      }
      uVar9 = 1;
      do {
        r_code::Atom::operator=
                  ((Atom *)((long)(destination->super_View).references +
                           (ulong)(iVar2 + uVar9 & 0xffff) * 4 + 0x18),
                   (this->super__Context).code +
                   (ulong)(uVar9 & 0xffff) * 4 + (ulong)(this->super__Context).index * 4);
        uVar9 = uVar9 + 1;
      } while ((ushort)uVar9 <= uVar6);
      return;
    }
    bVar5 = is_cmd_with_cptr(this);
    local_78 = uVar11;
    if (!bVar5) {
      uVar11 = local_80;
      if ((long)local_80 < 0) {
        cVar4 = r_code::Atom::getDescriptor();
        uVar11 = 0xffffffffffffffff;
        if ((cVar4 == -0x3d) &&
           ((sVar8 = r_code::Atom::asOpcode(), sVar8 == Opcodes::Pgm ||
            (sVar8 = r_code::Atom::asOpcode(), sVar8 == Opcodes::AntiPgm)))) {
          uVar11 = (ulong)(this->super__Context).index;
        }
      }
      uVar3 = local_84;
      if (uVar6 == 0) {
        return;
      }
      uVar12 = CONCAT62((int6)((ulong)extent_index >> 0x10),1);
      local_68 = extent_index;
      do {
        local_80 = CONCAT44(local_80._4_4_,(int)local_78 + (int)uVar12);
        getChild(&local_60,this,(uint16_t)uVar12);
        copy_member<r_exec::View>
                  (&local_60,destination,(uint16_t)local_80,local_68,
                   (bool)((uint16_t)uVar12 != 1 | (byte)uVar3),uVar11);
        uVar9 = (int)uVar12 + 1;
        uVar12 = (ulong)uVar9;
      } while ((ushort)uVar9 <= uVar6);
      return;
    }
    if (uVar6 == 0) {
      return;
    }
    index = 1;
    local_70 = (ulong)uVar9;
    do {
      sVar8 = (short)local_78;
      getChild(&local_60,this,index);
      copy_member<r_exec::View>
                (&local_60,destination,sVar8 + index,extent_index,index != 2,local_80);
      index = index + 1;
    } while (index <= (ushort)local_70);
    return;
  }
  uVar9 = iVar2 + 1;
  cVar4 = r_code::Atom::getDescriptor();
  if (cVar4 != -0x7a) {
    r_code::Atom::operator=
              ((Atom *)((long)(destination->super_View).references +
                       (ulong)(uVar9 & 0xffff) * 4 + 0x18),
               (this->super__Context).code + (ulong)(this->super__Context).index * 4 + 4);
    goto LAB_0019a4e6;
  }
  pAVar1 = (this->super__Context).code;
  uVar7 = r_code::Atom::asIndex();
  local_60.super__Context._vptr__Context._0_4_ = *(undefined4 *)(pAVar1 + (ulong)uVar7 * 4);
  cVar4 = r_code::Atom::getDescriptor();
  if (cVar4 == -0x7c) {
    pAVar1 = (this->super__Context).code;
    uVar7 = r_code::Atom::asIndex();
    r_code::Atom::operator=((Atom *)&local_60,pAVar1 + (ulong)uVar7 * 4);
  }
  cVar4 = r_code::Atom::getDescriptor();
  if (cVar4 == -0x78) {
    r_code::Atom::asInputIndex();
    r_code::Atom::RPointer((ushort)local_88);
    r_code::Atom::operator=
              ((Atom *)((long)(destination->super_View).references +
                       (ulong)(uVar9 & 0xffff) * 4 + 0x18),local_88);
LAB_0019a4af:
    r_code::Atom::~Atom(local_88);
  }
  else {
    if (cVar4 == -0x75) {
      r_code::Atom::asIndex();
      uVar7 = r_code::Atom::asIndex();
      r_code::Atom::VLPointer((ushort)local_88,uVar7);
      r_code::Atom::operator=
                ((Atom *)((long)(destination->super_View).references +
                         (ulong)(uVar9 & 0xffff) * 4 + 0x18),local_88);
      goto LAB_0019a4af;
    }
    r_code::Atom::operator=
              ((Atom *)((long)(destination->super_View).references +
                       (ulong)(uVar9 & 0xffff) * 4 + 0x18),
               (this->super__Context).code + (ulong)(this->super__Context).index * 4 + 4);
  }
  r_code::Atom::~Atom((Atom *)&local_60);
LAB_0019a4e6:
  if (1 < uVar6) {
    uVar9 = 2;
    do {
      r_code::Atom::operator=
                ((Atom *)((long)(destination->super_View).references +
                         (ulong)(iVar2 + uVar9 & 0xffff) * 4 + 0x18),
                 (this->super__Context).code +
                 (ulong)(uVar9 & 0xffff) * 4 + (ulong)(this->super__Context).index * 4);
      uVar9 = uVar9 + 1;
    } while ((ushort)uVar9 <= uVar6);
  }
  return;
}

Assistant:

void copy_structure(C *destination,
                                          uint16_t write_index,
                                          uint16_t &extent_index,
                                          bool dereference_cptr,
                                          int64_t pgm_index) const   // assumes the context is a structure; C: Object or View.
    {
        if ((*this)[0].getDescriptor() == Atom::OPERATOR && Operator::Get((*this)[0].asOpcode()).is_syn()) { // (\ (expression ...)).
            IPGMContext c = getChild(1);
            c.copy_member(destination, write_index, extent_index, dereference_cptr, pgm_index);
        } else {
            destination->code(write_index++) = (*this)[0];
            uint16_t atom_count = getChildrenCount();
            extent_index = write_index + atom_count;

            switch ((*this)[0].getDescriptor()) {
            case Atom::C_PTR: // copy members as is (no dereference).
                if ((*this)[1].getDescriptor() == Atom::VL_PTR) {
                    Atom a = code[(*this)[1].asIndex()];

                    if (a.getDescriptor() == Atom::I_PTR) {
                        a = code[a.asIndex()];
                    }

                    switch (a.getDescriptor()) {
                    case Atom::OUT_OBJ_PTR:
                        destination->code(write_index++) = Atom::VLPointer(code[(*this)[1].asIndex()].asIndex());
                        break;

                    case Atom::IN_OBJ_PTR: // TMP: assumes destination is a mk.rdx.
                        destination->code(write_index++) = Atom::RPointer(1 + a.asInputIndex());
                        break;

                    default:
                        destination->code(write_index++) = (*this)[1];
                        break;
                    }
                } else {
                    destination->code(write_index++) = (*this)[1];
                }

                for (uint16_t i = 2; i <= atom_count; ++i) {
                    destination->code(write_index++) = (*this)[i];
                }

                break;

            case Atom::TIMESTAMP: // copy members as is (no dereference).
                for (uint16_t i = 1; i <= atom_count; ++i) {
                    destination->code(write_index++) = (*this)[i];
                }

                break;

            default:
                if (is_cmd_with_cptr()) {
                    for (uint16_t i = 1; i <= atom_count; ++i) {
                        IPGMContext c = getChild(i);
                        c.copy_member(destination, write_index++, extent_index, i != 2, pgm_index);
                    }
                } else { // if a pgm is being copied, indicate the starting index of the pgm so that we can turn on code patching and know if a cptr is referencing code inside the pgm (in that case it will not be dereferenced).
                    int64_t _pgm_index;

                    if (pgm_index >= 0) {
                        _pgm_index = pgm_index;
                    } else if ((*this)[0].getDescriptor() == Atom::OBJECT && ((*this)[0].asOpcode() == Opcodes::Pgm || (*this)[0].asOpcode() == Opcodes::AntiPgm)) {
                        _pgm_index = index;
                    } else {
                        _pgm_index = -1;
                    }

                    for (uint16_t i = 1; i <= atom_count; ++i) {
                        IPGMContext c = getChild(i);
                        c.copy_member(destination, write_index++, extent_index, !(!dereference_cptr && i == 1), _pgm_index);
                    }
                }

                break;
            }
        }
    }